

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsInstPrinter.c
# Opt level: O1

void Mips_printInst(MCInst *MI,SStream *O,void *info)

{
  anon_union_1768_13_9c5aee68_for_cs_detail_6 *paVar1;
  char *pcVar2;
  uint8_t *puVar3;
  byte bVar4;
  char cVar5;
  cs_detail *pcVar6;
  _Bool _Var7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  mips_reg Op;
  MCOperand *pMVar11;
  MCRegisterClass *pMVar12;
  int64_t iVar13;
  ulong uVar14;
  SStream *extraout_RDX;
  SStream *extraout_RDX_00;
  SStream *O_00;
  int iVar15;
  SStream *in_R8;
  uint i;
  char *pcVar16;
  char *pcVar17;
  
  uVar8 = MCInst_getOpcode(MI);
  if (uVar8 - 0x582 < 2) {
    return;
  }
  if (uVar8 - 0x68b < 2) {
    return;
  }
  uVar8 = MCInst_getOpcode(MI);
  pcVar16 = (char *)0x0;
  if ((int)uVar8 < 0x28d) {
    if ((int)uVar8 < 299) {
      pcVar16 = (char *)0x0;
      switch(uVar8) {
      case 0xb0:
        uVar8 = MCInst_getNumOperands(MI);
        if (uVar8 == 2) {
          pcVar16 = (char *)0x0;
          pMVar11 = MCInst_getOperand(MI,0);
          uVar8 = MCOperand_getReg(pMVar11);
          if (uVar8 == 0x1f) {
            pcVar16 = "bc0f $\x02";
LAB_00226cc8:
            pcVar16 = cs_strdup(pcVar16);
            for (pcVar17 = pcVar16; cVar5 = *pcVar17, cVar5 != '\0'; pcVar17 = pcVar17 + 1) {
              if ((cVar5 == ' ') || (cVar5 == '\t')) {
                *pcVar17 = '\0';
                pcVar17 = pcVar17 + 1;
                break;
              }
            }
            SStream_concat0(O,pcVar16);
            if (*pcVar17 != '\0') {
              SStream_concat0(O,anon_var_dwarf_37585b + 0x11);
              do {
                cVar5 = *pcVar17;
                if (cVar5 == '$') {
                  pcVar2 = pcVar17 + 1;
                  if (*pcVar2 == -1) {
                    pcVar17 = pcVar17 + 3;
                  }
                  else {
                    pcVar17 = pcVar17 + 1;
                    printOperand(MI,(int)*pcVar2 - 1,O);
                  }
                }
                else {
                  if (cVar5 == '\0') break;
                  SStream_concat(O,"%c",(ulong)(uint)(int)cVar5);
                }
                pcVar17 = pcVar17 + 1;
              } while( true );
            }
          }
        }
        else {
LAB_002265cc:
          pcVar16 = (char *)0x0;
        }
        break;
      case 0xb1:
        uVar8 = MCInst_getNumOperands(MI);
        if (uVar8 != 2) goto LAB_002265cc;
        pcVar16 = (char *)0x0;
        pMVar11 = MCInst_getOperand(MI,0);
        uVar8 = MCOperand_getReg(pMVar11);
        if (uVar8 == 0x1f) {
          pcVar16 = "bc0fl $\x02";
          goto LAB_00226cc8;
        }
        break;
      case 0xb2:
        uVar8 = MCInst_getNumOperands(MI);
        if (uVar8 != 2) goto LAB_002265cc;
        pcVar16 = (char *)0x0;
        pMVar11 = MCInst_getOperand(MI,0);
        uVar8 = MCOperand_getReg(pMVar11);
        if (uVar8 == 0x1f) {
          pcVar16 = "bc0t $\x02";
          goto LAB_00226cc8;
        }
        break;
      case 0xb3:
        uVar8 = MCInst_getNumOperands(MI);
        if (uVar8 != 2) goto LAB_002265cc;
        pcVar16 = (char *)0x0;
        pMVar11 = MCInst_getOperand(MI,0);
        uVar8 = MCOperand_getReg(pMVar11);
        if (uVar8 == 0x1f) {
          pcVar16 = "bc0tl $\x02";
          goto LAB_00226cc8;
        }
        break;
      case 0xb4:
      case 0xb7:
      case 0xb8:
      case 0xbb:
      case 0xbc:
      case 0xbf:
        break;
      case 0xb5:
        uVar8 = MCInst_getNumOperands(MI);
        if (uVar8 != 2) goto LAB_002265cc;
        pcVar16 = (char *)0x0;
        pMVar11 = MCInst_getOperand(MI,0);
        uVar8 = MCOperand_getReg(pMVar11);
        if (uVar8 == 0x9b) {
          pcVar16 = "bc1f $\x02";
          goto LAB_00226cc8;
        }
        break;
      case 0xb6:
        uVar8 = MCInst_getNumOperands(MI);
        if (uVar8 != 2) goto LAB_002265cc;
        pcVar16 = (char *)0x0;
        pMVar11 = MCInst_getOperand(MI,0);
        uVar8 = MCOperand_getReg(pMVar11);
        if (uVar8 == 0x9b) {
          pcVar16 = "bc1fl $\x02";
          goto LAB_00226cc8;
        }
        break;
      case 0xb9:
        uVar8 = MCInst_getNumOperands(MI);
        if (uVar8 != 2) goto LAB_002265cc;
        pcVar16 = (char *)0x0;
        pMVar11 = MCInst_getOperand(MI,0);
        uVar8 = MCOperand_getReg(pMVar11);
        if (uVar8 == 0x9b) {
          pcVar16 = "bc1t $\x02";
          goto LAB_00226cc8;
        }
        break;
      case 0xba:
        uVar8 = MCInst_getNumOperands(MI);
        if (uVar8 != 2) goto LAB_002265cc;
        pcVar16 = (char *)0x0;
        pMVar11 = MCInst_getOperand(MI,0);
        uVar8 = MCOperand_getReg(pMVar11);
        if (uVar8 == 0x9b) {
          pcVar16 = "bc1tl $\x02";
          goto LAB_00226cc8;
        }
        break;
      case 0xbd:
        uVar8 = MCInst_getNumOperands(MI);
        if (uVar8 != 2) goto LAB_002265cc;
        pcVar16 = (char *)0x0;
        pMVar11 = MCInst_getOperand(MI,0);
        uVar8 = MCOperand_getReg(pMVar11);
        if (uVar8 == 0x1f) {
          pcVar16 = "bc2f $\x02";
          goto LAB_00226cc8;
        }
        break;
      case 0xbe:
        uVar8 = MCInst_getNumOperands(MI);
        if (uVar8 != 2) goto LAB_002265cc;
        pcVar16 = (char *)0x0;
        pMVar11 = MCInst_getOperand(MI,0);
        uVar8 = MCOperand_getReg(pMVar11);
        if (uVar8 == 0x1f) {
          pcVar16 = "bc2fl $\x02";
          goto LAB_00226cc8;
        }
        break;
      case 0xc0:
        uVar8 = MCInst_getNumOperands(MI);
        if (uVar8 != 2) goto LAB_002265cc;
        pcVar16 = (char *)0x0;
        pMVar11 = MCInst_getOperand(MI,0);
        uVar8 = MCOperand_getReg(pMVar11);
        if (uVar8 == 0x1f) {
          pcVar16 = "bc2t $\x02";
          goto LAB_00226cc8;
        }
        break;
      case 0xc1:
        uVar8 = MCInst_getNumOperands(MI);
        if (uVar8 != 2) goto LAB_002265cc;
        pcVar16 = (char *)0x0;
        pMVar11 = MCInst_getOperand(MI,0);
        uVar8 = MCOperand_getReg(pMVar11);
        if (uVar8 == 0x1f) {
          pcVar16 = "bc2tl $\x02";
          goto LAB_00226cc8;
        }
        break;
      case 0xc2:
        uVar8 = MCInst_getNumOperands(MI);
        if (uVar8 != 2) goto LAB_002265cc;
        pcVar16 = (char *)0x0;
        pMVar11 = MCInst_getOperand(MI,0);
        uVar8 = MCOperand_getReg(pMVar11);
        if (uVar8 == 0x1f) {
          pcVar16 = "bc3f $\x02";
          goto LAB_00226cc8;
        }
        break;
      case 0xc3:
        uVar8 = MCInst_getNumOperands(MI);
        if (uVar8 != 2) goto LAB_002265cc;
        pcVar16 = (char *)0x0;
        pMVar11 = MCInst_getOperand(MI,0);
        uVar8 = MCOperand_getReg(pMVar11);
        if (uVar8 == 0x1f) {
          pcVar16 = "bc3fl $\x02";
          goto LAB_00226cc8;
        }
        break;
      case 0xc4:
        uVar8 = MCInst_getNumOperands(MI);
        if (uVar8 != 2) goto LAB_002265cc;
        pcVar16 = (char *)0x0;
        pMVar11 = MCInst_getOperand(MI,0);
        uVar8 = MCOperand_getReg(pMVar11);
        if (uVar8 == 0x1f) {
          pcVar16 = "bc3t $\x02";
          goto LAB_00226cc8;
        }
        break;
      case 0xc5:
        uVar8 = MCInst_getNumOperands(MI);
        if (uVar8 != 2) goto LAB_002265cc;
        pcVar16 = (char *)0x0;
        pMVar11 = MCInst_getOperand(MI,0);
        uVar8 = MCOperand_getReg(pMVar11);
        if (uVar8 == 0x1f) {
          pcVar16 = "bc3tl $\x02";
          goto LAB_00226cc8;
        }
        break;
      default:
        if (uVar8 == 0x4d) {
          uVar8 = MCInst_getNumOperands(MI);
          if (uVar8 != 3) goto LAB_002265cc;
          pcVar16 = (char *)0x0;
          pMVar11 = MCInst_getOperand(MI,0);
          _Var7 = MCOperand_isReg(pMVar11);
          if (_Var7) {
            pMVar12 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
            pcVar16 = (char *)0x0;
            pMVar11 = MCInst_getOperand(MI,0);
            uVar8 = MCOperand_getReg(pMVar11);
            _Var7 = MCRegisterClass_contains(pMVar12,uVar8);
            if (_Var7) {
              pMVar11 = MCInst_getOperand(MI,1);
              _Var7 = MCOperand_isReg(pMVar11);
              if (_Var7) {
                pMVar12 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
                pMVar11 = MCInst_getOperand(MI,1);
                uVar8 = MCOperand_getReg(pMVar11);
                _Var7 = MCRegisterClass_contains(pMVar12,uVar8);
                if (_Var7) {
                  pMVar11 = MCInst_getOperand(MI,2);
                  uVar8 = MCOperand_getReg(pMVar11);
                  if (uVar8 == 0x15) {
LAB_00225e75:
                    pcVar16 = "move $\x01, $\x02";
                    goto LAB_00226cc8;
                  }
                }
              }
              goto LAB_002265cc;
            }
          }
        }
      }
    }
    else {
      if (uVar8 == 299) {
        uVar8 = MCInst_getNumOperands(MI);
        if (uVar8 == 2) {
          pMVar11 = MCInst_getOperand(MI,0);
          _Var7 = MCOperand_isImm(pMVar11);
          if (_Var7) {
            pMVar11 = MCInst_getOperand(MI,0);
            iVar13 = MCOperand_getImm(pMVar11);
            if (iVar13 == 0) {
              pMVar11 = MCInst_getOperand(MI,1);
              _Var7 = MCOperand_isImm(pMVar11);
              if (_Var7) {
                pMVar11 = MCInst_getOperand(MI,1);
                iVar13 = MCOperand_getImm(pMVar11);
                if (iVar13 == 0) {
                  pcVar16 = "break";
                  goto LAB_00226cc8;
                }
              }
            }
          }
        }
        uVar8 = MCInst_getNumOperands(MI);
        if (uVar8 == 2) {
          pMVar11 = MCInst_getOperand(MI,1);
          _Var7 = MCOperand_isImm(pMVar11);
          if (_Var7) {
            pMVar11 = MCInst_getOperand(MI,1);
            iVar13 = MCOperand_getImm(pMVar11);
            if (iVar13 == 0) {
              pcVar16 = "break $\x01";
              goto LAB_00226cc8;
            }
          }
        }
        goto LAB_002265cc;
      }
      if (uVar8 == 0x222) {
        uVar8 = MCInst_getNumOperands(MI);
        if (uVar8 != 3) goto LAB_002265cc;
        pcVar16 = (char *)0x0;
        pMVar11 = MCInst_getOperand(MI,0);
        _Var7 = MCOperand_isReg(pMVar11);
        if (_Var7) {
          pMVar12 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,0x23);
          pcVar16 = (char *)0x0;
          pMVar11 = MCInst_getOperand(MI,0);
          uVar8 = MCOperand_getReg(pMVar11);
          _Var7 = MCRegisterClass_contains(pMVar12,uVar8);
          if (_Var7) {
            pMVar11 = MCInst_getOperand(MI,1);
            _Var7 = MCOperand_isReg(pMVar11);
            if (_Var7) {
              pMVar12 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,0x23);
              pMVar11 = MCInst_getOperand(MI,1);
              uVar8 = MCOperand_getReg(pMVar11);
              _Var7 = MCRegisterClass_contains(pMVar12,uVar8);
              if (_Var7) {
                pMVar11 = MCInst_getOperand(MI,2);
                uVar8 = MCOperand_getReg(pMVar11);
                if (uVar8 == 0x14b) goto LAB_00225e75;
              }
            }
            goto LAB_002265cc;
          }
        }
      }
      else if (uVar8 == 0x233) {
        uVar8 = MCInst_getNumOperands(MI);
        if (uVar8 != 1) goto LAB_002265cc;
        pcVar16 = (char *)0x0;
        pMVar11 = MCInst_getOperand(MI,0);
        uVar8 = MCOperand_getReg(pMVar11);
        if (uVar8 == 0x15) {
          pcVar16 = "di";
          goto LAB_00226cc8;
        }
      }
    }
  }
  else if ((int)uVar8 < 0x666) {
    if ((int)uVar8 < 0x598) {
      if (0x37a < (int)uVar8) {
        if (uVar8 == 0x37b) {
          uVar8 = MCInst_getNumOperands(MI);
          if (uVar8 == 2) {
            pcVar16 = (char *)0x0;
            pMVar11 = MCInst_getOperand(MI,0);
            uVar8 = MCOperand_getReg(pMVar11);
            if (uVar8 != 0x14b) goto switchD_00225252_caseD_b4;
            pMVar11 = MCInst_getOperand(MI,1);
            _Var7 = MCOperand_isReg(pMVar11);
            if (_Var7) {
              uVar8 = 0x23;
LAB_00225ed7:
              pMVar12 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,uVar8);
              pMVar11 = MCInst_getOperand(MI,1);
              uVar8 = MCOperand_getReg(pMVar11);
              _Var7 = MCRegisterClass_contains(pMVar12,uVar8);
              if (_Var7) {
                pcVar16 = "jr $\x02";
                goto LAB_00226cc8;
              }
            }
          }
        }
        else if (uVar8 == 0x380) {
          uVar8 = MCInst_getNumOperands(MI);
          if (uVar8 == 2) {
            pcVar16 = (char *)0x0;
            pMVar11 = MCInst_getOperand(MI,0);
            uVar8 = MCOperand_getReg(pMVar11);
            if (uVar8 != 0x13) goto switchD_00225252_caseD_b4;
            pMVar11 = MCInst_getOperand(MI,1);
            _Var7 = MCOperand_isReg(pMVar11);
            if (_Var7) {
              pMVar12 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
              pMVar11 = MCInst_getOperand(MI,1);
              uVar8 = MCOperand_getReg(pMVar11);
              _Var7 = MCRegisterClass_contains(pMVar12,uVar8);
              if (_Var7) {
                pcVar16 = "jalr.hb $\x02";
                goto LAB_00226cc8;
              }
            }
          }
        }
        else {
          if (uVar8 != 0x469) goto switchD_00225252_caseD_b4;
          uVar8 = MCInst_getNumOperands(MI);
          if (uVar8 == 2) {
            pcVar16 = (char *)0x0;
            pMVar11 = MCInst_getOperand(MI,0);
            uVar8 = MCOperand_getReg(pMVar11);
            if (uVar8 != 0x15) goto switchD_00225252_caseD_b4;
            pMVar11 = MCInst_getOperand(MI,1);
            uVar8 = MCOperand_getReg(pMVar11);
            if (uVar8 == 0x15) {
LAB_0022592e:
              pcVar16 = "nop";
              goto LAB_00226cc8;
            }
          }
        }
        goto LAB_002265cc;
      }
      if (uVar8 == 0x28d) {
        uVar8 = MCInst_getNumOperands(MI);
        if (uVar8 != 1) goto LAB_002265cc;
        pcVar16 = (char *)0x0;
        pMVar11 = MCInst_getOperand(MI,0);
        uVar8 = MCOperand_getReg(pMVar11);
        if (uVar8 == 0x15) {
          pcVar16 = "ei";
          goto LAB_00226cc8;
        }
      }
      else if (uVar8 == 0x379) {
        uVar8 = MCInst_getNumOperands(MI);
        if (uVar8 == 2) {
          pcVar16 = (char *)0x0;
          pMVar11 = MCInst_getOperand(MI,0);
          uVar8 = MCOperand_getReg(pMVar11);
          if (uVar8 != 0x15) goto switchD_00225252_caseD_b4;
          pMVar11 = MCInst_getOperand(MI,1);
          _Var7 = MCOperand_isReg(pMVar11);
          if (_Var7) {
            uVar8 = 8;
            goto LAB_00225ed7;
          }
        }
        goto LAB_002265cc;
      }
    }
    else if ((int)uVar8 < 0x5e1) {
      if ((uVar8 == 0x598) || (uVar8 == 0x59b)) {
        uVar8 = MCInst_getNumOperands(MI);
        if (uVar8 != 1) goto LAB_002265cc;
        pcVar16 = (char *)0x0;
        pMVar11 = MCInst_getOperand(MI,0);
        _Var7 = MCOperand_isImm(pMVar11);
        if (_Var7) {
          pcVar16 = (char *)0x0;
          pMVar11 = MCInst_getOperand(MI,0);
          iVar13 = MCOperand_getImm(pMVar11);
          if (iVar13 == 0) {
            pcVar16 = "sdbbp";
            goto LAB_00226cc8;
          }
        }
      }
    }
    else {
      if ((uVar8 == 0x5e1) || (uVar8 == 0x5ee)) {
        uVar8 = MCInst_getNumOperands(MI);
        if (uVar8 == 3) {
          pcVar16 = (char *)0x0;
          pMVar11 = MCInst_getOperand(MI,0);
          uVar8 = MCOperand_getReg(pMVar11);
          if (uVar8 != 0x15) goto switchD_00225252_caseD_b4;
          pMVar11 = MCInst_getOperand(MI,1);
          uVar8 = MCOperand_getReg(pMVar11);
          if (uVar8 == 0x15) {
            pMVar11 = MCInst_getOperand(MI,2);
            _Var7 = MCOperand_isImm(pMVar11);
            if (_Var7) {
              pMVar11 = MCInst_getOperand(MI,2);
              iVar13 = MCOperand_getImm(pMVar11);
              if (iVar13 == 0) goto LAB_0022592e;
            }
          }
        }
        goto LAB_002265cc;
      }
      if (uVar8 == 0x63e) {
        uVar8 = MCInst_getNumOperands(MI);
        if (uVar8 != 3) goto LAB_002265cc;
        pcVar16 = (char *)0x0;
        pMVar11 = MCInst_getOperand(MI,0);
        _Var7 = MCOperand_isReg(pMVar11);
        if (_Var7) {
          pMVar12 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
          pcVar16 = (char *)0x0;
          pMVar11 = MCInst_getOperand(MI,0);
          uVar8 = MCOperand_getReg(pMVar11);
          _Var7 = MCRegisterClass_contains(pMVar12,uVar8);
          if (_Var7) {
            pMVar11 = MCInst_getOperand(MI,1);
            uVar8 = MCOperand_getReg(pMVar11);
            if (uVar8 == 0x15) {
              pMVar11 = MCInst_getOperand(MI,2);
              _Var7 = MCOperand_isReg(pMVar11);
              if (_Var7) {
                pMVar12 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
                pMVar11 = MCInst_getOperand(MI,2);
                uVar8 = MCOperand_getReg(pMVar11);
                _Var7 = MCRegisterClass_contains(pMVar12,uVar8);
                if (_Var7) {
                  pcVar16 = "neg $\x01, $\x03";
                  goto LAB_00226cc8;
                }
              }
            }
            goto LAB_002265cc;
          }
        }
      }
    }
  }
  else if ((int)uVar8 < 0x6bf) {
    if ((int)uVar8 < 0x684) {
      if (uVar8 == 0x666) {
        uVar8 = MCInst_getNumOperands(MI);
        if (uVar8 != 3) goto LAB_002265cc;
        pcVar16 = (char *)0x0;
        pMVar11 = MCInst_getOperand(MI,0);
        _Var7 = MCOperand_isReg(pMVar11);
        if (_Var7) {
          pMVar12 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
          pcVar16 = (char *)0x0;
          pMVar11 = MCInst_getOperand(MI,0);
          uVar8 = MCOperand_getReg(pMVar11);
          _Var7 = MCRegisterClass_contains(pMVar12,uVar8);
          if (_Var7) {
            pMVar11 = MCInst_getOperand(MI,1);
            uVar8 = MCOperand_getReg(pMVar11);
            if (uVar8 == 0x15) {
              pMVar11 = MCInst_getOperand(MI,2);
              _Var7 = MCOperand_isReg(pMVar11);
              if (_Var7) {
                pMVar12 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
                pMVar11 = MCInst_getOperand(MI,2);
                uVar8 = MCOperand_getReg(pMVar11);
                _Var7 = MCRegisterClass_contains(pMVar12,uVar8);
                if (_Var7) {
                  pcVar16 = "negu $\x01, $\x03";
                  goto LAB_00226cc8;
                }
              }
            }
            goto LAB_002265cc;
          }
        }
      }
      else if (uVar8 == 0x681) {
        uVar8 = MCInst_getNumOperands(MI);
        if (uVar8 != 1) goto LAB_002265cc;
        pcVar16 = (char *)0x0;
        pMVar11 = MCInst_getOperand(MI,0);
        _Var7 = MCOperand_isImm(pMVar11);
        if (_Var7) {
          pcVar16 = (char *)0x0;
          pMVar11 = MCInst_getOperand(MI,0);
          iVar13 = MCOperand_getImm(pMVar11);
          if (iVar13 == 0) {
            pcVar16 = "sync";
            goto LAB_00226cc8;
          }
        }
      }
    }
    else if (uVar8 == 0x684) {
      uVar8 = MCInst_getNumOperands(MI);
      if (uVar8 != 1) goto LAB_002265cc;
      pcVar16 = (char *)0x0;
      pMVar11 = MCInst_getOperand(MI,0);
      _Var7 = MCOperand_isImm(pMVar11);
      if (_Var7) {
        pcVar16 = (char *)0x0;
        pMVar11 = MCInst_getOperand(MI,0);
        iVar13 = MCOperand_getImm(pMVar11);
        if (iVar13 == 0) {
          pcVar16 = "syscall";
          goto LAB_00226cc8;
        }
      }
    }
    else if (uVar8 == 0x6b6) {
      uVar8 = MCInst_getNumOperands(MI);
      if (uVar8 != 3) goto LAB_002265cc;
      pcVar16 = (char *)0x0;
      pMVar11 = MCInst_getOperand(MI,0);
      _Var7 = MCOperand_isReg(pMVar11);
      if (_Var7) {
        pMVar12 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
        pcVar16 = (char *)0x0;
        pMVar11 = MCInst_getOperand(MI,0);
        uVar8 = MCOperand_getReg(pMVar11);
        _Var7 = MCRegisterClass_contains(pMVar12,uVar8);
        if (_Var7) {
          pMVar11 = MCInst_getOperand(MI,1);
          _Var7 = MCOperand_isReg(pMVar11);
          if (_Var7) {
            pMVar12 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
            pMVar11 = MCInst_getOperand(MI,1);
            uVar8 = MCOperand_getReg(pMVar11);
            _Var7 = MCRegisterClass_contains(pMVar12,uVar8);
            if (_Var7) {
              pMVar11 = MCInst_getOperand(MI,2);
              _Var7 = MCOperand_isImm(pMVar11);
              if (_Var7) {
                pMVar11 = MCInst_getOperand(MI,2);
                iVar13 = MCOperand_getImm(pMVar11);
                if (iVar13 == 0) {
                  pcVar16 = "teq $\x01, $\x02";
                  goto LAB_00226cc8;
                }
              }
            }
          }
          goto LAB_002265cc;
        }
      }
    }
    else if (uVar8 == 0x6ba) {
      uVar8 = MCInst_getNumOperands(MI);
      if (uVar8 != 3) goto LAB_002265cc;
      pcVar16 = (char *)0x0;
      pMVar11 = MCInst_getOperand(MI,0);
      _Var7 = MCOperand_isReg(pMVar11);
      if (_Var7) {
        pMVar12 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
        pcVar16 = (char *)0x0;
        pMVar11 = MCInst_getOperand(MI,0);
        uVar8 = MCOperand_getReg(pMVar11);
        _Var7 = MCRegisterClass_contains(pMVar12,uVar8);
        if (_Var7) {
          pMVar11 = MCInst_getOperand(MI,1);
          _Var7 = MCOperand_isReg(pMVar11);
          if (_Var7) {
            pMVar12 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
            pMVar11 = MCInst_getOperand(MI,1);
            uVar8 = MCOperand_getReg(pMVar11);
            _Var7 = MCRegisterClass_contains(pMVar12,uVar8);
            if (_Var7) {
              pMVar11 = MCInst_getOperand(MI,2);
              _Var7 = MCOperand_isImm(pMVar11);
              if (_Var7) {
                pMVar11 = MCInst_getOperand(MI,2);
                iVar13 = MCOperand_getImm(pMVar11);
                if (iVar13 == 0) {
                  pcVar16 = "tge $\x01, $\x02";
                  goto LAB_00226cc8;
                }
              }
            }
          }
          goto LAB_002265cc;
        }
      }
    }
  }
  else if ((int)uVar8 < 0x6ce) {
    if (uVar8 == 0x6bf) {
      uVar8 = MCInst_getNumOperands(MI);
      if (uVar8 != 3) goto LAB_002265cc;
      pcVar16 = (char *)0x0;
      pMVar11 = MCInst_getOperand(MI,0);
      _Var7 = MCOperand_isReg(pMVar11);
      if (_Var7) {
        pMVar12 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
        pcVar16 = (char *)0x0;
        pMVar11 = MCInst_getOperand(MI,0);
        uVar8 = MCOperand_getReg(pMVar11);
        _Var7 = MCRegisterClass_contains(pMVar12,uVar8);
        if (_Var7) {
          pMVar11 = MCInst_getOperand(MI,1);
          _Var7 = MCOperand_isReg(pMVar11);
          if (_Var7) {
            pMVar12 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
            pMVar11 = MCInst_getOperand(MI,1);
            uVar8 = MCOperand_getReg(pMVar11);
            _Var7 = MCRegisterClass_contains(pMVar12,uVar8);
            if (_Var7) {
              pMVar11 = MCInst_getOperand(MI,2);
              _Var7 = MCOperand_isImm(pMVar11);
              if (_Var7) {
                pMVar11 = MCInst_getOperand(MI,2);
                iVar13 = MCOperand_getImm(pMVar11);
                if (iVar13 == 0) {
                  pcVar16 = "tgeu $\x01, $\x02";
                  goto LAB_00226cc8;
                }
              }
            }
          }
          goto LAB_002265cc;
        }
      }
    }
    else if (uVar8 == 0x6ca) {
      uVar8 = MCInst_getNumOperands(MI);
      if (uVar8 != 3) goto LAB_002265cc;
      pcVar16 = (char *)0x0;
      pMVar11 = MCInst_getOperand(MI,0);
      _Var7 = MCOperand_isReg(pMVar11);
      if (_Var7) {
        pMVar12 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
        pcVar16 = (char *)0x0;
        pMVar11 = MCInst_getOperand(MI,0);
        uVar8 = MCOperand_getReg(pMVar11);
        _Var7 = MCRegisterClass_contains(pMVar12,uVar8);
        if (_Var7) {
          pMVar11 = MCInst_getOperand(MI,1);
          _Var7 = MCOperand_isReg(pMVar11);
          if (_Var7) {
            pMVar12 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
            pMVar11 = MCInst_getOperand(MI,1);
            uVar8 = MCOperand_getReg(pMVar11);
            _Var7 = MCRegisterClass_contains(pMVar12,uVar8);
            if (_Var7) {
              pMVar11 = MCInst_getOperand(MI,2);
              _Var7 = MCOperand_isImm(pMVar11);
              if (_Var7) {
                pMVar11 = MCInst_getOperand(MI,2);
                iVar13 = MCOperand_getImm(pMVar11);
                if (iVar13 == 0) {
                  pcVar16 = "tlt $\x01, $\x02";
                  goto LAB_00226cc8;
                }
              }
            }
          }
          goto LAB_002265cc;
        }
      }
    }
  }
  else if (uVar8 == 0x6ce) {
    uVar8 = MCInst_getNumOperands(MI);
    if (uVar8 != 3) goto LAB_002265cc;
    pcVar16 = (char *)0x0;
    pMVar11 = MCInst_getOperand(MI,0);
    _Var7 = MCOperand_isReg(pMVar11);
    if (_Var7) {
      pMVar12 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
      pcVar16 = (char *)0x0;
      pMVar11 = MCInst_getOperand(MI,0);
      uVar8 = MCOperand_getReg(pMVar11);
      _Var7 = MCRegisterClass_contains(pMVar12,uVar8);
      if (_Var7) {
        pMVar11 = MCInst_getOperand(MI,1);
        _Var7 = MCOperand_isReg(pMVar11);
        if (_Var7) {
          pMVar12 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
          pMVar11 = MCInst_getOperand(MI,1);
          uVar8 = MCOperand_getReg(pMVar11);
          _Var7 = MCRegisterClass_contains(pMVar12,uVar8);
          if (_Var7) {
            pMVar11 = MCInst_getOperand(MI,2);
            _Var7 = MCOperand_isImm(pMVar11);
            if (_Var7) {
              pMVar11 = MCInst_getOperand(MI,2);
              iVar13 = MCOperand_getImm(pMVar11);
              if (iVar13 == 0) {
                pcVar16 = "tltu $\x01, $\x02";
                goto LAB_00226cc8;
              }
            }
          }
        }
        goto LAB_002265cc;
      }
    }
  }
  else if (uVar8 == 0x6d1) {
    uVar8 = MCInst_getNumOperands(MI);
    if (uVar8 != 3) goto LAB_002265cc;
    pcVar16 = (char *)0x0;
    pMVar11 = MCInst_getOperand(MI,0);
    _Var7 = MCOperand_isReg(pMVar11);
    if (_Var7) {
      pMVar12 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
      pcVar16 = (char *)0x0;
      pMVar11 = MCInst_getOperand(MI,0);
      uVar8 = MCOperand_getReg(pMVar11);
      _Var7 = MCRegisterClass_contains(pMVar12,uVar8);
      if (_Var7) {
        pMVar11 = MCInst_getOperand(MI,1);
        _Var7 = MCOperand_isReg(pMVar11);
        if (_Var7) {
          pMVar12 = MCRegisterInfo_getRegClass((MCRegisterInfo *)info,8);
          pMVar11 = MCInst_getOperand(MI,1);
          uVar8 = MCOperand_getReg(pMVar11);
          _Var7 = MCRegisterClass_contains(pMVar12,uVar8);
          if (_Var7) {
            pMVar11 = MCInst_getOperand(MI,2);
            _Var7 = MCOperand_isImm(pMVar11);
            if (_Var7) {
              pMVar11 = MCInst_getOperand(MI,2);
              iVar13 = MCOperand_getImm(pMVar11);
              if (iVar13 == 0) {
                pcVar16 = "tne $\x01, $\x02";
                goto LAB_00226cc8;
              }
            }
          }
        }
        goto LAB_002265cc;
      }
    }
  }
  else if (uVar8 == 0x6e8) {
    uVar8 = MCInst_getNumOperands(MI);
    pcVar16 = (char *)0x0;
    if (uVar8 == 1) {
      pMVar11 = MCInst_getOperand(MI,0);
      _Var7 = MCOperand_isImm(pMVar11);
      if (_Var7) {
        pcVar16 = (char *)0x0;
        pMVar11 = MCInst_getOperand(MI,0);
        iVar13 = MCOperand_getImm(pMVar11);
        if (iVar13 == 0) {
          pcVar16 = "wait";
          goto LAB_00226cc8;
        }
      }
    }
  }
switchD_00225252_caseD_b4:
  if (pcVar16 != (char *)0x0) goto switchD_00226ef2_caseD_0;
  uVar8 = MCInst_getOpcode(MI);
  pcVar16 = (char *)0x0;
  pcVar17 = (char *)0x0;
  if ((int)uVar8 < 0x112) {
    if ((int)uVar8 < 0xcf) {
      if (uVar8 == 0xb5) {
        _Var7 = isReg(MI,0,0x9b);
        pcVar16 = (char *)0x0;
        if (_Var7) {
          pcVar16 = "bc1f";
LAB_00226860:
          uVar8 = 1;
LAB_00226868:
          pcVar16 = printAlias1(pcVar16,MI,uVar8,O);
        }
      }
      else if (uVar8 == 0xb9) {
        _Var7 = isReg(MI,0,0x9b);
        pcVar16 = (char *)0x0;
        if (_Var7) {
          pcVar16 = "bc1t";
          goto LAB_00226860;
        }
      }
      else {
        pcVar16 = pcVar17;
        if (uVar8 == 0xce) goto LAB_00226672;
      }
    }
    else if ((int)uVar8 < 0xdb) {
      if (uVar8 == 0xcf) {
        uVar8 = 0x14b;
      }
      else {
        if (uVar8 != 0xd6) goto LAB_00226873;
LAB_00226672:
        _Var7 = isReg(MI,0,0x15);
        if ((_Var7) && (_Var7 = isReg(MI,1,0x15), _Var7)) {
          pcVar16 = "b";
          uVar8 = 2;
          goto LAB_00226868;
        }
        uVar8 = 0x15;
      }
      _Var7 = isReg(MI,1,uVar8);
      if (_Var7) {
        pcVar16 = "beqz";
        goto LAB_0022680d;
      }
LAB_0022681f:
      pcVar16 = (char *)0x0;
    }
    else if (uVar8 == 0xdb) {
      _Var7 = isReg(MI,0,0x15);
      pcVar16 = (char *)0x0;
      if (_Var7) {
        pcVar16 = "bal";
        goto LAB_00226860;
      }
    }
    else {
      pcVar16 = pcVar17;
      if (uVar8 == 0x111) {
        uVar8 = 0x15;
        goto LAB_002267fd;
      }
    }
  }
  else {
    if ((int)uVar8 < 0x4fa) {
      if (uVar8 != 0x112) {
        if (uVar8 == 0x379) {
          uVar8 = 0x13;
        }
        else {
          pcVar16 = pcVar17;
          if (uVar8 != 0x37b) goto LAB_00226873;
          uVar8 = 0x115;
        }
        pcVar16 = (char *)0x0;
        _Var7 = isReg(MI,0,uVar8);
        if (_Var7) {
          pcVar16 = "jalr";
          goto LAB_00226860;
        }
        goto LAB_00226873;
      }
      uVar8 = 0x14b;
LAB_002267fd:
      _Var7 = isReg(MI,1,uVar8);
      if (!_Var7) goto LAB_0022681f;
      pcVar16 = "bnez";
LAB_0022680d:
      uVar8 = 2;
    }
    else {
      if ((int)uVar8 < 0x4fd) {
        if (uVar8 == 0x4fa) {
LAB_00226747:
          uVar8 = 0x15;
        }
        else {
          pcVar16 = pcVar17;
          if (uVar8 != 0x4fb) goto LAB_00226873;
          uVar8 = 0x14b;
        }
        _Var7 = isReg(MI,2,uVar8);
        if (!_Var7) goto LAB_0022681f;
        pcVar16 = "not";
      }
      else {
        if (uVar8 == 0x4fd) goto LAB_00226747;
        pcVar16 = pcVar17;
        if (uVar8 != 0x505) goto LAB_00226873;
        _Var7 = isReg(MI,2,0x15);
        if (!_Var7) goto LAB_0022681f;
        pcVar16 = "move";
      }
      uVar8 = 1;
    }
    pcVar16 = printAlias2(pcVar16,MI,uVar8,(uint)O,in_R8);
  }
LAB_00226873:
  if (pcVar16 != (char *)0x0) goto switchD_00226ef2_caseD_0;
  uVar8 = MCInst_getOpcode(MI);
  uVar8 = *(uint *)(printInstruction_OpInfo + (ulong)uVar8 * 4);
  uVar9 = MCInst_getOpcode(MI);
  bVar4 = printInstruction_OpInfo2[uVar9];
  SStream_concat0(O,&UNK_003f7e3f + (uVar8 & 0x3fff));
  switch(uVar8 >> 0xe & 0xf) {
  case 1:
    uVar9 = 0;
    break;
  case 2:
    uVar9 = 1;
    goto LAB_00226a2a;
  case 3:
    uVar9 = 2;
LAB_00226a2a:
    printOperand(MI,uVar9,O);
    pcVar16 = ", ";
LAB_00226af9:
    SStream_concat0(O,pcVar16);
    goto LAB_00226b01;
  case 4:
    pcVar16 = (char *)0x0;
    printUnsignedImm8(MI,0,O);
    goto switchD_00226ef2_caseD_0;
  case 5:
    printUnsignedImm(MI,2,O);
    SStream_concat0(O,", ");
  case 9:
    iVar15 = 0;
LAB_00226adb:
    pcVar16 = (char *)0x0;
    printMemOperand(MI,iVar15,O);
    goto switchD_00226ef2_caseD_0;
  case 6:
    pMVar11 = MCInst_getOperand(MI,2);
    uVar14 = MCOperand_getImm(pMVar11);
    if ((uVar14 & 0xffffffe0) == 0) {
      pcVar16 = &DAT_003fa354 + *(int *)(&DAT_003fa354 + (ulong)((uint)uVar14 & 0x1f) * 4);
    }
    else {
      pcVar16 = (char *)0x0;
    }
    goto LAB_00226af9;
  case 7:
    uVar9 = MCInst_getNumOperands(MI);
    if (uVar9 != 2) {
      i = 0;
      do {
        if (i != 0) {
          SStream_concat0(O,", ");
        }
        pMVar11 = MCInst_getOperand(MI,i);
        uVar10 = MCOperand_getReg(pMVar11);
        SStream_concat(O,"$%s",&getRegisterName_AsmStrs +
                               *(ushort *)(getRegisterName_RegAsmOffset + (ulong)(uVar10 - 1) * 2));
        if (MI->csh->detail != CS_OPT_OFF) {
          pcVar6 = MI->flat_insn->detail;
          puVar3 = pcVar6->groups + (ulong)(pcVar6->field_6).x86.prefix[0] * 0x18 + 0x15;
          puVar3[0] = '\x01';
          puVar3[1] = '\0';
          puVar3[2] = '\0';
          puVar3[3] = '\0';
          pcVar6 = MI->flat_insn->detail;
          *(uint *)(pcVar6->groups + (ulong)(pcVar6->field_6).x86.prefix[0] * 0x18 + 0x1d) = uVar10;
          paVar1 = &MI->flat_insn->detail->field_6;
          (paVar1->x86).prefix[0] = (paVar1->x86).prefix[0] + '\x01';
        }
        i = i + 1;
      } while (uVar9 - 2 != i);
    }
    SStream_concat0(O,", ");
    goto LAB_00226b01;
  case 8:
    pMVar11 = MCInst_getOperand(MI,0);
    uVar8 = MCOperand_getReg(pMVar11);
    SStream_concat(O,"$%s",&getRegisterName_AsmStrs +
                           *(ushort *)(getRegisterName_RegAsmOffset + (ulong)(uVar8 - 1) * 2));
    SStream_concat0(O,", ");
    iVar15 = 2;
    goto LAB_00226adb;
  case 10:
    uVar9 = 3;
    break;
  default:
    goto switchD_002268e9_default;
  }
  printOperand(MI,uVar9,O);
LAB_00226b01:
  switch(uVar8 >> 0x12 & 0x1f) {
  case 1:
    printOperand(MI,2,O);
    O_00 = extraout_RDX;
    goto LAB_00226c53;
  case 2:
    goto switchD_002268e9_default;
  case 3:
    goto switchD_00226b25_caseD_3;
  case 4:
    SStream_concat0(O,", $pc, ");
    goto switchD_00226b25_caseD_3;
  case 5:
    pcVar16 = " # 16 bit inst";
    break;
  case 6:
    goto switchD_00226b25_caseD_6;
  case 7:
    goto switchD_00226b25_caseD_7;
  case 8:
    pcVar16 = ".d\t";
    goto LAB_00226c10;
  case 9:
    pcVar16 = ".s\t";
LAB_00226c10:
    SStream_concat0(O,pcVar16);
    printOperand(MI,0,O);
    SStream_concat0(O,", ");
    uVar8 = 1;
LAB_00226eb7:
    pcVar16 = (char *)0x0;
    printOperand(MI,uVar8,O);
    goto switchD_00226ef2_caseD_0;
  case 10:
    pcVar16 = ", [";
    goto LAB_00226c4b;
  case 0xb:
    pcVar16 = "\n\tnop";
    break;
  case 0xc:
    pcVar16 = "\t# branch\n\tnop";
    break;
  case 0xd:
    goto switchD_00226b25_caseD_d;
  case 0xe:
    SStream_concat0(O,", 1f\n\tb\t2f\n\t.align\t2\n1: \t.word\t");
    printOperand(MI,1,O);
    pcVar16 = "\n2:";
    break;
  case 0xf:
    iVar15 = 2;
    goto LAB_00226cb4;
  case 0x10:
    pcVar16 = ", .+4\n\t\n\tmove ";
    goto LAB_00226b74;
  default:
    pcVar16 = "  , ";
LAB_00226c4b:
    SStream_concat0(O,pcVar16 + 2);
    O_00 = extraout_RDX_00;
LAB_00226c53:
    switch(uVar8 >> 0x17 & 0xf) {
    case 1:
      break;
    case 2:
      printOperand(MI,2,O);
      pcVar17 = ", ";
      pcVar16 = (char *)0x0;
      switch(uVar8 >> 0x1b & 0xf) {
      default:
        goto switchD_00226ef2_caseD_0;
      case 1:
        goto switchD_00226ef2_caseD_1;
      case 2:
switchD_00226ef2_caseD_2:
        pcVar16 = "\t# 16 bit inst";
        break;
      case 3:
switchD_00226b25_caseD_6:
        pcVar16 = "  # 16 bit inst";
        break;
      case 4:
switchD_00226ef2_caseD_4:
        pcVar16 = "\n\tbteqz\t";
        goto LAB_00226b93;
      case 5:
switchD_00226ef2_caseD_5:
        pcVar16 = "\n\tbtnez\t";
        goto LAB_00226b93;
      case 6:
switchD_00226ef2_caseD_6:
        pcVar17 = "[";
        goto switchD_00226ef2_caseD_1;
      case 7:
switchD_00226ef2_caseD_7:
        pcVar16 = " \t# 16 bit inst";
        break;
      case 8:
switchD_00226ef2_caseD_8:
        pcVar16 = ", 32";
        break;
      case 9:
switchD_00226ef2_caseD_9:
        SStream_concat0(O,"\n\taddiu\t");
        printOperand(MI,1,O);
        SStream_concat0(O,", $pc, ");
        printOperand(MI,3,O);
        pcVar16 = "\n ";
        break;
      case 10:
switchD_00226ef2_caseD_a:
        SStream_concat0(O,"(");
        printOperand(MI,1,O);
        pcVar16 = ")";
        break;
      case 0xb:
switchD_00226ef2_caseD_b:
        SStream_concat0(O," ( ");
        printOperand(MI,1,O);
        pcVar16 = " ); ";
        break;
      case 0xc:
switchD_00226ef2_caseD_c:
        pcVar16 = ", 0";
        break;
      case 0xd:
switchD_00226ef2_caseD_d:
        pcVar16 = "\n\tbteqz\t.+4\n\tmove ";
        goto LAB_00226b74;
      case 0xe:
switchD_00226ef2_caseD_e:
        pcVar16 = "\n\tbtnez\t.+4\n\tmove ";
LAB_00226b74:
        SStream_concat0(O,pcVar16);
        printOperand(MI,1,O);
        pcVar16 = ", ";
LAB_00226b93:
        SStream_concat0(O,pcVar16);
        uVar8 = 2;
        goto LAB_00226bf3;
      }
      goto LAB_00226f04;
    case 3:
      printMemOperandEA(MI,(uint)O,O_00);
      break;
    case 4:
      printUnsignedImm(MI,1,O);
      pcVar17 = ", ";
      pcVar16 = (char *)0x0;
      switch(uVar8 >> 0x1b & 0xf) {
      default:
        goto switchD_00226ef2_caseD_0;
      case 1:
        goto switchD_00226ef2_caseD_1;
      case 2:
        goto switchD_00226ef2_caseD_2;
      case 3:
        goto switchD_00226b25_caseD_6;
      case 4:
        goto switchD_00226ef2_caseD_4;
      case 5:
        goto switchD_00226ef2_caseD_5;
      case 6:
        goto switchD_00226ef2_caseD_6;
      case 7:
        goto switchD_00226ef2_caseD_7;
      case 8:
        goto switchD_00226ef2_caseD_8;
      case 9:
        goto switchD_00226ef2_caseD_9;
      case 10:
        goto switchD_00226ef2_caseD_a;
      case 0xb:
        goto switchD_00226ef2_caseD_b;
      case 0xc:
        goto switchD_00226ef2_caseD_c;
      case 0xd:
        goto switchD_00226ef2_caseD_d;
      case 0xe:
        goto switchD_00226ef2_caseD_e;
      }
    case 5:
      printUnsignedImm(MI,3,O);
      pcVar16 = "], ";
      goto LAB_00226b93;
    case 6:
      printUnsignedImm(MI,2,O);
      SStream_concat0(O,"], ");
      printOperand(MI,3,O);
      SStream_concat0(O,"[");
      printUnsignedImm(MI,4,O);
      goto switchD_00227159_caseD_2;
    case 7:
switchD_00226b25_caseD_d:
      iVar15 = 1;
LAB_00226cb4:
      printMemOperand(MI,iVar15,O);
      break;
    case 8:
      SStream_concat0(O,", ");
      goto LAB_00226e09;
    case 9:
      SStream_concat0(O,"\n\tmflo\t");
switchD_00226b25_caseD_7:
      uVar8 = 0;
      goto LAB_00226eb7;
    case 10:
      printOperand(MI,4,O);
      pcVar17 = ", ";
      pcVar16 = (char *)0x0;
      switch(uVar8 >> 0x1b & 0xf) {
      default:
        goto switchD_00226ef2_caseD_0;
      case 1:
        goto switchD_00226ef2_caseD_1;
      case 2:
        goto switchD_00226ef2_caseD_2;
      case 3:
        goto switchD_00226b25_caseD_6;
      case 4:
        goto switchD_00226ef2_caseD_4;
      case 5:
        goto switchD_00226ef2_caseD_5;
      case 6:
        goto switchD_00226ef2_caseD_6;
      case 7:
        goto switchD_00226ef2_caseD_7;
      case 8:
        goto switchD_00226ef2_caseD_8;
      case 9:
        goto switchD_00226ef2_caseD_9;
      case 10:
        goto switchD_00226ef2_caseD_a;
      case 0xb:
        goto switchD_00226ef2_caseD_b;
      case 0xc:
        goto switchD_00226ef2_caseD_c;
      case 0xd:
        goto switchD_00226ef2_caseD_d;
      case 0xe:
        goto switchD_00226ef2_caseD_e;
      }
    case 0xb:
      SStream_concat0(O,"\n\tmove\t");
      pcVar16 = (char *)0x0;
      printOperand(MI,0,O);
      SStream_concat0(O,", $t8");
      goto switchD_00226ef2_caseD_0;
    default:
      printOperand(MI,1,O);
      pcVar17 = ", ";
      pcVar16 = (char *)0x0;
      switch(uVar8 >> 0x1b & 0xf) {
      default:
        goto switchD_00226ef2_caseD_0;
      case 1:
        goto switchD_00226ef2_caseD_1;
      case 2:
        goto switchD_00226ef2_caseD_2;
      case 3:
        goto switchD_00226b25_caseD_6;
      case 4:
        goto switchD_00226ef2_caseD_4;
      case 5:
        goto switchD_00226ef2_caseD_5;
      case 6:
        goto switchD_00226ef2_caseD_6;
      case 7:
        goto switchD_00226ef2_caseD_7;
      case 8:
        goto switchD_00226ef2_caseD_8;
      case 9:
        goto switchD_00226ef2_caseD_9;
      case 10:
        goto switchD_00226ef2_caseD_a;
      case 0xb:
        goto switchD_00226ef2_caseD_b;
      case 0xc:
        goto switchD_00226ef2_caseD_c;
      case 0xd:
        goto switchD_00226ef2_caseD_d;
      case 0xe:
        goto switchD_00226ef2_caseD_e;
      }
    }
    goto switchD_002268e9_default;
  }
LAB_00226f04:
  SStream_concat0(O,pcVar16);
switchD_002268e9_default:
  pcVar16 = (char *)0x0;
switchD_00226ef2_caseD_0:
  if (pcVar16 == (char *)0x0) {
    return;
  }
  Op = Mips_map_insn(pcVar16);
  MCInst_setOpcodePub(MI,Op);
  (*cs_mem_free)(pcVar16);
  return;
switchD_00226b25_caseD_3:
  uVar8 = 1;
  goto LAB_00226bf3;
switchD_00226ef2_caseD_1:
  SStream_concat0(O,pcVar17);
  switch((uint)(CONCAT14(bVar4,uVar8) >> 0x1f) & 7) {
  case 1:
    break;
  case 2:
    printUnsignedImm(MI,2,O);
    pcVar16 = (char *)0x0;
    switch(bVar4 >> 2 & 3) {
    default:
      goto switchD_00226ef2_caseD_0;
    case 1:
      goto switchD_00227159_caseD_1;
    case 2:
      goto switchD_00227159_caseD_2;
    }
  case 3:
    printUnsignedImm8(MI,3,O);
    pcVar16 = (char *)0x0;
    switch(bVar4 >> 2 & 3) {
    default:
      goto switchD_00226ef2_caseD_0;
    case 1:
      goto switchD_00227159_caseD_1;
    case 2:
      goto switchD_00227159_caseD_2;
    }
  case 4:
    printOperand(MI,3,O);
    pcVar16 = (char *)0x0;
    switch(bVar4 >> 2 & 3) {
    default:
      goto switchD_00226ef2_caseD_0;
    case 1:
      goto switchD_00227159_caseD_1;
    case 2:
      goto switchD_00227159_caseD_2;
    }
  default:
    printOperand(MI,2,O);
    pcVar16 = (char *)0x0;
    switch(bVar4 >> 2 & 3) {
    default:
      goto switchD_00226ef2_caseD_0;
    case 1:
      goto switchD_00227159_caseD_1;
    case 2:
      goto switchD_00227159_caseD_2;
    }
  }
  printUnsignedImm8(MI,2,O);
  pcVar16 = (char *)0x0;
  switch(bVar4 >> 2 & 3) {
  default:
    goto switchD_00226ef2_caseD_0;
  case 1:
switchD_00227159_caseD_1:
    SStream_concat0(O,", ");
    if ((bVar4 & 0x10) == 0) {
      printUnsignedImm(MI,3,O);
    }
    else {
LAB_00226e09:
      uVar8 = 3;
LAB_00226bf3:
      printOperand(MI,uVar8,O);
    }
    break;
  case 2:
switchD_00227159_caseD_2:
    pcVar16 = "]";
    goto LAB_00226f04;
  }
  goto switchD_002268e9_default;
}

Assistant:

void Mips_printInst(MCInst *MI, SStream *O, void *info)
{
	char *mnem;

	switch (MCInst_getOpcode(MI)) {
		default: break;
		case Mips_Save16:
		case Mips_SaveX16:
		case Mips_Restore16:
		case Mips_RestoreX16:
			return;
	}

	// Try to print any aliases first.
	mnem = printAliasInstr(MI, O, info);
	if (!mnem) {
		mnem = printAlias(MI, O);
		if (!mnem) {
			printInstruction(MI, O, NULL);
		}
	}

	if (mnem) {
		// fixup instruction id due to the change in alias instruction
		MCInst_setOpcodePub(MI, Mips_map_insn(mnem));
		cs_mem_free(mnem);
	}
}